

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.hpp
# Opt level: O0

void cpp_properties::encode_latin1_to_utf8<char>
               (char code_point,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *utf8)

{
  uint8_t ch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *utf8_local;
  char code_point_local;
  
  if ((byte)code_point < 0x80) {
    std::__cxx11::string::operator+=((string *)utf8,code_point);
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)utf8,(byte)((int)((byte)code_point & 0xc0) >> 6) | 0xc0);
    std::__cxx11::string::operator+=((string *)utf8,code_point & 0x3fU | 0x80);
  }
  return;
}

Assistant:

void encode_latin1_to_utf8(const CharT code_point, std::basic_string<CharT> &utf8) {
  /* code points above 0xff are impossible since iso 8859-1 is 8-bit encoded */
  uint8_t ch = code_point;

  if (ch < 0x80) {
    utf8 += ch;
  } else {
    utf8 += 0xc0 | (ch & 0xc0) >> 6; // first byte
    utf8 += 0x80 | (ch & 0x3f);      // last byte
  }
}